

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_combo_begin(nk_context *ctx,nk_window *win,nk_vec2 size,int is_clicked,nk_rect header)

{
  uint uVar1;
  nk_window *pnVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  nk_rect body;
  nk_rect header_00;
  
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x58fa,
                  "int nk_combo_begin(struct nk_context *, struct nk_window *, struct nk_vec2, int, struct nk_rect)"
                 );
  }
  if (ctx->current->layout != (nk_panel *)0x0) {
    pnVar2 = (win->popup).win;
    fVar7 = (ctx->style).window.combo_border;
    uVar1 = (win->popup).combo_count;
    (win->popup).combo_count = uVar1 + 1;
    iVar4 = 0;
    if ((pnVar2 == (nk_window *)0x0) || ((win->popup).name != uVar1)) {
      bVar5 = false;
    }
    else {
      bVar5 = (win->popup).type == NK_PANEL_COMBO;
    }
    if ((is_clicked != 0 || pnVar2 != (nk_window *)0x0) && (pnVar2 == (nk_window *)0x0 || bVar5)) {
      body.y = (header.y + header.h) - fVar7;
      body.x = header.x;
      uVar6 = 0;
      fVar7 = 0.0;
      fVar8 = 0.0;
      if (is_clicked == 0 || pnVar2 == (nk_window *)0x0) {
        uVar6 = header._8_8_;
        fVar7 = header.x;
        fVar8 = header.y;
      }
      iVar4 = 0;
      header_00.y = fVar8;
      header_00.x = fVar7;
      body._8_8_ = size;
      header_00.w = (float)(int)uVar6;
      header_00.h = (float)(int)((ulong)uVar6 >> 0x20);
      iVar3 = nk_nonblock_begin(ctx,0,body,header_00,NK_PANEL_COMBO);
      if (iVar3 != 0) {
        (win->popup).type = NK_PANEL_COMBO;
        (win->popup).name = uVar1;
        iVar4 = 1;
      }
    }
    return iVar4;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x58fb,
                "int nk_combo_begin(struct nk_context *, struct nk_window *, struct nk_vec2, int, struct nk_rect)"
               );
}

Assistant:

NK_INTERN int
nk_combo_begin(struct nk_context *ctx, struct nk_window *win,
    struct nk_vec2 size, int is_clicked, struct nk_rect header)
{
    struct nk_window *popup;
    int is_open = 0;
    int is_active = 0;
    struct nk_rect body;
    nk_hash hash;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    popup = win->popup.win;
    body.x = header.x;
    body.w = size.x;
    body.y = header.y + header.h-ctx->style.window.combo_border;
    body.h = size.y;

    hash = win->popup.combo_count++;
    is_open = (popup) ? nk_true:nk_false;
    is_active = (popup && (win->popup.name == hash) && win->popup.type == NK_PANEL_COMBO);
    if ((is_clicked && is_open && !is_active) || (is_open && !is_active) ||
        (!is_open && !is_active && !is_clicked)) return 0;
    if (!nk_nonblock_begin(ctx, 0, body,
        (is_clicked && is_open)?nk_rect(0,0,0,0):header, NK_PANEL_COMBO)) return 0;

    win->popup.type = NK_PANEL_COMBO;
    win->popup.name = hash;
    return 1;
}